

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoordCalc.h
# Opt level: O1

void __thiscall boundingBoxTy::boundingBoxTy(boundingBoxTy *this)

{
  posFlagsTy *ppVar1;
  
  (this->nw)._lat = NAN;
  (this->nw)._lon = NAN;
  (this->nw)._alt = NAN;
  (this->nw)._ts = NAN;
  (this->nw)._head = NAN;
  (this->nw)._pitch = NAN;
  (this->nw)._roll = NAN;
  (this->nw).mergeCount = 1;
  ppVar1 = &(this->nw).f;
  *ppVar1 = (posFlagsTy)((ushort)*ppVar1 & 0x8000);
  (this->nw).edgeIdx = 0xffffffffffffffff;
  (this->se)._lat = NAN;
  (this->se)._lon = NAN;
  (this->se)._alt = NAN;
  (this->se)._ts = NAN;
  (this->se)._head = NAN;
  (this->se)._pitch = NAN;
  (this->se)._roll = NAN;
  (this->se).mergeCount = 1;
  ppVar1 = &(this->se).f;
  *ppVar1 = (posFlagsTy)((ushort)*ppVar1 & 0x8000);
  (this->se).edgeIdx = 0xffffffffffffffff;
  return;
}

Assistant:

positionTy () : _lat(NAN), _lon(NAN), _alt(NAN), _ts(NAN), _head(NAN), _pitch(NAN), _roll(NAN),
    f{FPH_UNKNOWN,false,GND_UNKNOWN,UNIT_WORLD,UNIT_DEG,SPOS_NONE,false}
    {}